

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

iterator * __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::end
          (iterator *__return_storage_ptr__,
          IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
          *this)

{
  function<bool_(const_int_&)> *this_00;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> local_a8;
  
  local_a8.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_001575e0;
  local_a8.source.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  local_a8.source.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->source).source.source.state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8.source.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->source).source.source.state.
       super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_a8.source.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.source.source.state.
       super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.source.source.state.
                      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.source.source.state.
       super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.source.source.state.
                      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  this_00 = &local_a8.transformer;
  std::function<bool_(const_int_&)>::function(this_00,&(this->source).transformer);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_Rb_tree(&local_a8.result._M_t,&(this->source).result._M_t);
  local_a8.current._M_node = (this->source).current._M_node;
  iterator::iterator(__return_storage_ptr__,&local_a8,false);
  local_a8.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_001575e0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_a8.result._M_t);
  if (local_a8.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.transformer.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  local_a8.source.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_a8.source.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.source.source.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }